

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_repeat_matcher.hpp
# Opt level: O1

bool __thiscall
boost::xpressive::detail::
simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::any_matcher>,mpl_::bool_<false>>
::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::any_matcher>,mpl_::bool_<false>>
           *this,long *state,long *next)

{
  int iVar1;
  long lVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  
  lVar2 = *state;
  iVar1 = *(int *)(this + 4);
  if (iVar1 != 0) {
    lVar5 = *state;
    iVar4 = iVar1;
    do {
      if (lVar5 == state[4]) {
        *(undefined1 *)((long)state + 0x31) = 1;
        goto LAB_00132487;
      }
      lVar5 = lVar5 + 1;
      *state = lVar5;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  uVar6 = iVar1 - 1;
  while( true ) {
    cVar3 = (**(code **)(*next + 0x10))(next,state);
    if (cVar3 != '\0') {
      return true;
    }
    uVar6 = uVar6 + 1;
    if (*(uint *)(this + 8) <= uVar6) goto LAB_00132487;
    if (*state == state[4]) break;
    *state = *state + 1;
  }
  *(undefined1 *)((long)state + 0x31) = 1;
LAB_00132487:
  *state = lVar2;
  return false;
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, non_greedy_tag) const
        {
            BOOST_ASSERT(!this->leading_);
            BidiIter const tmp = state.cur_;
            unsigned int matches = 0;

            for(; matches < this->min_; ++matches)
            {
                if(!this->xpr_.match(state))
                {
                    state.cur_ = tmp;
                    return false;
                }
            }

            do
            {
                if(next.match(state))
                {
                    return true;
                }
            }
            while(matches++ < this->max_ && this->xpr_.match(state));

            state.cur_ = tmp;
            return false;
        }